

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

bool __thiscall
r_exec::CTPX::build_requirement(CTPX *this,HLPBindingMap *bm,Code *m0,uint64_t period)

{
  atomic_int_fast64_t *paVar1;
  value_type mdl;
  short sVar2;
  int iVar3;
  _Fact *this_00;
  Code *object;
  uint64_t uVar4;
  undefined4 extraout_var;
  long *plVar5;
  Code *pCVar6;
  undefined4 extraout_var_00;
  _TPX *this_01;
  GuardBuilder *this_02;
  ModelBase *this_03;
  bool bVar7;
  _TPX *this_04;
  uint16_t write_index;
  uint16_t premise_index;
  P<r_code::Code> m1;
  Code *new_cst;
  Code *_m1;
  Code *_m0;
  uint16_t local_64;
  ushort local_62;
  P<r_code::Code> local_60;
  value_type local_58;
  Code *local_50;
  Code *local_48;
  Code *local_40;
  Code *local_38;
  
  this_00 = _TPX::find_f_icst(&this->super__TPX,(_Fact *)(this->super__TPX).super_TPX.target.object,
                              &local_62,&local_48);
  if (this_00 == (_Fact *)0x0) {
    return false;
  }
  object = (Code *)HLPBindingMap::build_f_ihlp(bm,m0,Opcodes::IMdl,false);
  if (object != (Code *)0x0) {
    LOCK();
    paVar1 = &(object->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  uVar4 = _Fact::get_after(this_00);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>(object,2,uVar4);
  uVar4 = _Fact::get_before(this_00);
  r_code::Utils::SetIndirectTimestamp<r_code::Code>(object,3,uVar4);
  pCVar6 = local_48;
  if (local_48 == (Code *)0x0) {
    iVar3 = (*(this_00->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this_00,0);
    plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                               ((long *)CONCAT44(extraout_var,iVar3),0);
    sVar2 = (**(code **)(*plVar5 + 0x50))(plVar5);
    pCVar6 = (Code *)(**(code **)(*plVar5 + 0x48))(plVar5,sVar2 + -1);
  }
  local_50 = m0;
  iVar3 = (*(pCVar6->super__Object)._vptr__Object[9])(pCVar6,(ulong)local_62);
  this_01 = (_TPX *)operator_new(0x40);
  this_04 = this_01;
  HLPBindingMap::HLPBindingMap((HLPBindingMap *)this_01);
  LOCK();
  paVar1 = &(this_01->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_58.object =
       &_TPX::build_mdl_head(this_04,(HLPBindingMap *)this_01,0,this_00,(_Fact *)object,&local_64)->
        super__Object;
  if ((Code *)local_58.object != (Code *)0x0) {
    LOCK();
    paVar1 = &((_Object *)&(local_58.object)->_vptr__Object)->refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  this_02 = (GuardBuilder *)operator_new(0x10);
  GuardBuilder::GuardBuilder(this_02);
  mdl.object = local_58.object;
  LOCK();
  paVar1 = &(this_02->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  (*(this_02->super__Object)._vptr__Object[2])
            (this_02,local_58.object,CONCAT44(extraout_var_00,iVar3),0,&local_64);
  _TPX::build_mdl_tail(&this->super__TPX,(Code *)mdl.object,local_64);
  this_03 = ModelBase::Get();
  ModelBase::check_existence(this_03,local_50,(Code *)mdl.object,&local_38,&local_40);
  if (local_40 != (Code *)0x0) {
    bVar7 = true;
    if (local_40 != (Code *)mdl.object) goto LAB_0019494b;
    if (local_38 != (Code *)0x0) {
      if (local_38 == local_50) {
        local_60.object = &local_50->super__Object;
        LOCK();
        paVar1 = &(local_50->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>
                  ((vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)
                   &(this->super__TPX).mdls,&local_60);
        if ((Code *)local_60.object != (Code *)0x0) {
          LOCK();
          ((local_60.object)->refCount).super___atomic_base<long>._M_i =
               ((local_60.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_60.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*((_Object *)&(local_60.object)->_vptr__Object)->_vptr__Object[1])();
          }
        }
      }
      if (local_48 != (Code *)0x0) {
        local_60.object = &local_48->super__Object;
        LOCK();
        paVar1 = &(local_48->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        std::vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>>::
        emplace_back<core::P<r_code::Code>>
                  ((vector<core::P<r_code::Code>,std::allocator<core::P<r_code::Code>>> *)
                   &(this->super__TPX).csts,&local_60);
        if ((Code *)local_60.object != (Code *)0x0) {
          LOCK();
          ((local_60.object)->refCount).super___atomic_base<long>._M_i =
               ((local_60.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_60.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*((_Object *)&(local_60.object)->_vptr__Object)->_vptr__Object[1])();
          }
        }
      }
      std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::push_back
                (&(this->super__TPX).mdls,&local_58);
      goto LAB_0019494b;
    }
  }
  bVar7 = false;
LAB_0019494b:
  LOCK();
  paVar1 = &(this_02->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((this_02->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
    (*(this_02->super__Object)._vptr__Object[1])(this_02);
  }
  if ((Code *)local_58.object != (Code *)0x0) {
    LOCK();
    ((local_58.object)->refCount).super___atomic_base<long>._M_i =
         ((local_58.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_58.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*((_Object *)&(local_58.object)->_vptr__Object)->_vptr__Object[1])();
    }
  }
  LOCK();
  paVar1 = &(this_01->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((this_01->super_TPX).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
    (*(this_01->super_TPX).super__Object._vptr__Object[1])(this_01);
  }
  if (object != (Code *)0x0) {
    LOCK();
    paVar1 = &(object->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if ((object->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
      (*(object->super__Object)._vptr__Object[1])(object);
    }
  }
  return bVar7;
}

Assistant:

bool CTPX::build_requirement(HLPBindingMap *bm, Code *m0, uint64_t period)   // check for mdl existence at the same time (ModelBase::mdlCS-wise).
{
    uint16_t premise_index;
    Code *new_cst;
    _Fact *f_icst = find_f_icst(target, premise_index, new_cst);

    if (f_icst == nullptr) { //std::cout<<Utils::RelativeTime(Now())<<" failed xxxxxxxxx M1 / 0\n";
        return false;
    }

    P<Fact> f_im0 = bm->build_f_ihlp(m0, Opcodes::IMdl, false);
    Utils::SetIndirectTimestamp<Code>(f_im0, FACT_AFTER, f_icst->get_after());
    Utils::SetIndirectTimestamp<Code>(f_im0, FACT_BEFORE, f_icst->get_before());
    Code *unpacked_cst;

    if (new_cst == nullptr) {
        Code *cst = f_icst->get_reference(0)->get_reference(0);
        unpacked_cst = cst->get_reference(cst->references_size() - CST_HIDDEN_REFS); // the cst is packed, retrieve the pattern from the unpacked code.
    } else {
        unpacked_cst = new_cst;
    }

    _Fact *premise_pattern = (_Fact *)unpacked_cst->get_reference(premise_index);
    P<HLPBindingMap> _bm = new HLPBindingMap();
    uint16_t write_index;
    P<Code> m1 = build_mdl_head(_bm, 0, f_icst, f_im0, write_index);
    P<GuardBuilder> guard_builder = new GuardBuilder();
    guard_builder->build(m1, premise_pattern, nullptr, write_index);
    build_mdl_tail(m1, write_index);
    Code *_m0;
    Code *_m1;
    ModelBase::Get()->check_existence(m0, m1, _m0, _m1);

    if (_m1 == nullptr) {
        return false;
    } else if (_m1 == m1) {
        if (_m0 == nullptr) {
            return false;
        } else if (_m0 == m0) {
            mdls.push_back(m0);
        }

        if (new_cst != nullptr) {
            csts.push_back(new_cst);
        }

        mdls.push_back(m1);
    } // if m1 alrady exists, new_cst==NULL.

    //std::cout<<Utils::RelativeTime(Now()<<" found --------------------- M1\n";
    return true;
}